

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilePOSIX.cpp
# Opt level: O3

void __thiscall
adios2::transport::FilePOSIX::Open
          (FilePOSIX *this,string *name,Mode openMode,bool async,bool directio)

{
  string *__rhs;
  pointer pcVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Result<int> *this_00;
  int *piVar5;
  long *plVar6;
  size_type *psVar7;
  element_type *peVar8;
  _State_baseV2 *__tmp;
  element_type *peVar9;
  string *process;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  __basic_future<int> local_178;
  element_type *local_168;
  long *local_160;
  undefined1 local_158 [40];
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  __rhs = &(this->super_Transport).m_Name;
  std::__cxx11::string::_M_assign((string *)__rhs);
  (*(this->super_Transport)._vptr_Transport[0x13])(this);
  this->m_DirectIO = directio;
  (this->super_Transport).m_OpenMode = openMode;
  if (openMode == Append) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"open","");
    Transport::ProfilerStart(&this->super_Transport,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    piVar5 = __errno_location();
    *piVar5 = 0;
    iVar3 = open((this->super_Transport).m_Name._M_dataplus._M_p,(uint)directio << 0xe | 0x42,0x1ff)
    ;
    this->m_FileDescriptor = iVar3;
    lseek(iVar3,0,2);
    this->m_Errno = *piVar5;
    peVar9 = (element_type *)&local_b0.field_2;
    process = &local_b0;
    local_b0._M_dataplus._M_p = (pointer)peVar9;
LAB_00647869:
    std::__cxx11::string::_M_construct<char_const*>((string *)process,"open","");
    Transport::ProfilerStop(&this->super_Transport,process);
    peVar8 = (element_type *)(process->_M_dataplus)._M_p;
    if (peVar8 == peVar9) goto LAB_00647889;
  }
  else {
    if (openMode == Read) {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"open","");
      Transport::ProfilerStart(&this->super_Transport,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      piVar5 = __errno_location();
      *piVar5 = 0;
      iVar3 = open((this->super_Transport).m_Name._M_dataplus._M_p,0);
      this->m_FileDescriptor = iVar3;
      this->m_Errno = *piVar5;
      peVar9 = (element_type *)&local_f0.field_2;
      process = &local_f0;
      local_f0._M_dataplus._M_p = (pointer)peVar9;
      goto LAB_00647869;
    }
    if (openMode == Write) {
      if (async) {
        this->m_IsOpening = true;
        local_158._0_8_ = (element_type *)0x0;
        local_158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x78);
        p_Var4->_M_use_count = 1;
        p_Var4->_M_weak_count = 1;
        p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00873fd8;
        local_168 = (element_type *)(p_Var4 + 1);
        p_Var4[1]._M_use_count = 0;
        p_Var4[1]._M_weak_count = 0;
        *(undefined4 *)&p_Var4[2]._vptr__Sp_counted_base = 0;
        *(undefined1 *)((long)&p_Var4[2]._vptr__Sp_counted_base + 4) = 0;
        p_Var4[2]._M_use_count = 0;
        p_Var4[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var4[3]._M_use_count = 0;
        p_Var4[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_00874028;
        this_00 = (_Result<int> *)operator_new(0x18);
        std::__future_base::_Result<int>::_Result(this_00);
        p_Var4[4]._vptr__Sp_counted_base = (_func_int **)this_00;
        *(bool *)&p_Var4[4]._M_use_count = directio;
        p_Var4[5]._vptr__Sp_counted_base = (_func_int **)(p_Var4 + 6);
        pcVar1 = (name->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(p_Var4 + 5),pcVar1,pcVar1 + name->_M_string_length);
        peVar9 = local_168;
        p_Var4[7]._vptr__Sp_counted_base = (_func_int **)this;
        local_178._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_160 = (long *)operator_new(0x20);
        *local_160 = (long)&PTR___State_00874080;
        local_160[1] = (long)peVar9;
        local_160[2] = (long)std::__future_base::
                             _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FilePOSIX.cpp:88:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_int>
                             ::_M_run;
        local_160[3] = 0;
        std::thread::_M_start_thread(&local_178,&local_160,0);
        if (local_160 != (long *)0x0) {
          (**(code **)(*local_160 + 8))();
        }
        if (p_Var4[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
          std::terminate();
        }
        p_Var4[3]._vptr__Sp_counted_base =
             (_func_int **)
             local_178._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        local_158._0_8_ = peVar9;
        local_158._8_8_ = p_Var4;
        std::__basic_future<int>::__basic_future(&local_178,(__state_type *)local_158);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
        }
        _Var2._M_pi = local_178._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        peVar9 = local_178._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_178._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_178._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var4 = (this->m_OpenFuture).super___basic_future<int>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        (this->m_OpenFuture).super___basic_future<int>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             peVar9;
        (this->m_OpenFuture).super___basic_future<int>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = _Var2._M_pi;
        if ((p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4),
           local_178._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_178._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        goto LAB_00647889;
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"open","");
      Transport::ProfilerStart(&this->super_Transport,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      piVar5 = __errno_location();
      *piVar5 = 0;
      iVar3 = open((this->super_Transport).m_Name._M_dataplus._M_p,(uint)directio << 0xe | 0x241,
                   0x1b6);
      this->m_FileDescriptor = iVar3;
      this->m_Errno = *piVar5;
      peVar9 = (element_type *)&local_70.field_2;
      process = &local_70;
      local_70._M_dataplus._M_p = (pointer)peVar9;
      goto LAB_00647869;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   "unknown open mode for file ",__rhs);
    plVar6 = (long *)std::__cxx11::string::append((char *)local_158);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_110.field_2._M_allocated_capacity = *psVar7;
      local_110.field_2._8_8_ = plVar6[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar7;
      local_110._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_110._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    CheckFile(this,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    peVar8 = (element_type *)local_158._0_8_;
    if ((element_type *)local_158._0_8_ == (element_type *)(local_158 + 0x10)) goto LAB_00647889;
  }
  operator_delete(peVar8);
LAB_00647889:
  if (this->m_IsOpening == false) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   "couldn\'t open file ",__rhs);
    plVar6 = (long *)std::__cxx11::string::append((char *)local_158);
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_130.field_2._M_allocated_capacity = *psVar7;
      local_130.field_2._8_8_ = plVar6[3];
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar7;
      local_130._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_130._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    CheckFile(this,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((element_type *)local_158._0_8_ != (element_type *)(local_158 + 0x10)) {
      operator_delete((void *)local_158._0_8_);
    }
    (this->super_Transport).m_IsOpen = true;
  }
  return;
}

Assistant:

void FilePOSIX::Open(const std::string &name, const Mode openMode, const bool async,
                     const bool directio)
{
    auto lf_AsyncOpenWrite = [&](const std::string &name, const bool directio) -> int {
        ProfilerStart("open");
        errno = 0;
        int flag = __GetOpenFlag(O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, directio);
        int FD = open(m_Name.c_str(), flag, 0666);
        m_Errno = errno;
        ProfilerStop("open");
        return FD;
    };

    m_Name = name;
    CheckName();
    m_DirectIO = directio;
    m_OpenMode = openMode;
    switch (m_OpenMode)
    {

    case Mode::Write:
        if (async)
        {
            m_IsOpening = true;
            m_OpenFuture = std::async(std::launch::async, lf_AsyncOpenWrite, name, directio);
        }
        else
        {
            ProfilerStart("open");
            errno = 0;
            m_FileDescriptor =
                open(m_Name.c_str(),
                     __GetOpenFlag(O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, directio), 0666);
            m_Errno = errno;
            ProfilerStop("open");
        }
        break;

    case Mode::Append:
        ProfilerStart("open");
        errno = 0;
        m_FileDescriptor =
            open(m_Name.c_str(), __GetOpenFlag(O_RDWR | O_CREAT | O_BINARY, directio), 0777);
        lseek(m_FileDescriptor, 0, SEEK_END);
        m_Errno = errno;
        ProfilerStop("open");
        break;

    case Mode::Read:
        ProfilerStart("open");
        errno = 0;
        m_FileDescriptor = open(m_Name.c_str(), O_RDONLY | O_BINARY);
        m_Errno = errno;
        ProfilerStop("open");
        break;

    default:
        CheckFile("unknown open mode for file " + m_Name + ", in call to POSIX open");
    }

    if (!m_IsOpening)
    {
        CheckFile("couldn't open file " + m_Name + ", in call to POSIX open");
        m_IsOpen = true;
    }
}